

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

void __thiscall
flatbuffers::php::PhpGenerator::GetMemberOfVectorOfStruct
          (PhpGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  Value *this_00;
  BaseType BVar1;
  StructDef *pSVar2;
  size_t sVar3;
  Type *type;
  Type *type_00;
  Type *type_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  StructDef *local_98;
  string local_90;
  Type vectortype;
  string local_50;
  
  pbVar4 = &bStack_f8;
  BVar1 = (field->value).type.element;
  pSVar2 = (field->value).type.struct_def;
  vectortype.enum_def = (field->value).type.enum_def;
  vectortype.fixed_length = (field->value).type.fixed_length;
  vectortype.element = BASE_TYPE_NONE;
  local_98 = struct_def;
  vectortype.base_type = BVar1;
  vectortype.struct_def = pSVar2;
  std::operator+(&bStack_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::append((string *)code_ptr);
  this_00 = &field->value;
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::operator+(&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," * @return");
  GenTypeBasic_abi_cxx11_(&local_90,(PhpGenerator *)this_00,type);
  std::operator+(&local_d8,&local_b8,&local_90);
  std::operator+(&bStack_f8,&local_d8,"\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  std::operator+(&bStack_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," */\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::operator+(&bStack_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"public function get");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_f8);
  ConvertCase(&bStack_f8,(string *)field,kUpperCamel,kSnake);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&bStack_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  std::operator+(&local_b8,&local_90,"$o = $this->__offset(");
  NumToString<unsigned_short>(&local_50,(field->value).offset);
  std::operator+(&local_d8,&local_b8,&local_50);
  std::operator+(&bStack_f8,&local_d8,");\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator+(&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  std::operator+(&bStack_f8,&local_d8,"$obj = new ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  GenTypeGet_abi_cxx11_(&local_b8,(PhpGenerator *)this_00,type_00);
  ConvertCase(&local_d8,&local_b8,kUpperCamel,kSnake);
  std::operator+(&bStack_f8,&local_d8,"();\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  switch((this_00->type).base_type) {
  case BASE_TYPE_STRING:
    break;
  case BASE_TYPE_VECTOR:
    if (BVar1 != BASE_TYPE_STRUCT) goto switchD_001d6c01_default;
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&bStack_f8,&local_d8,"return $o != 0 ? $obj->init(");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (pSVar2->fixed == true) {
      std::__cxx11::string::append((char *)code_ptr);
      sVar3 = InlineSize(&vectortype);
      NumToString<unsigned_long>(&bStack_f8,sVar3);
      std::__cxx11::string::append((string *)code_ptr);
    }
    else {
      std::__cxx11::string::append((char *)code_ptr);
      sVar3 = InlineSize(&vectortype);
      NumToString<unsigned_long>(&local_d8,sVar3);
      std::operator+(&bStack_f8,&local_d8,")");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&bStack_f8);
      pbVar4 = &local_d8;
    }
    std::__cxx11::string::~string((string *)pbVar4);
    break;
  case BASE_TYPE_STRUCT:
    if (local_98->fixed == true) {
      std::operator+(&bStack_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Indent_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Indent_abi_cxx11_);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&bStack_f8);
      NumToString<unsigned_short>(&local_b8,(field->value).offset);
      std::operator+(&local_d8,"return $o != 0 ? $obj->init($this->bb_pos +",&local_b8);
      std::operator+(&bStack_f8,&local_d8,", $this->bb) : null;\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&bStack_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      pbVar4 = &local_b8;
      goto LAB_001d6d2d;
    }
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&bStack_f8,&local_d8,"return $o != 0 ? $obj->init(");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::append((char *)code_ptr);
    break;
  case BASE_TYPE_UNION:
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&bStack_f8,&local_d8,"return $o != 0 ? $this->");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    GenGetter_abi_cxx11_(&local_d8,(PhpGenerator *)this_00,type_01);
    std::operator+(&bStack_f8,&local_d8,"($obj, $o); null;\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_f8);
    pbVar4 = &local_d8;
LAB_001d6d2d:
    std::__cxx11::string::~string((string *)pbVar4);
  default:
    goto switchD_001d6c01_default;
  }
  std::__cxx11::string::append((char *)code_ptr);
switchD_001d6c01_default:
  std::operator+(&bStack_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_f8);
  return;
}

Assistant:

void GetMemberOfVectorOfStruct(const StructDef &struct_def,
                                 const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    code += Indent + "/**\n";
    code += Indent + " * @return" + GenTypeBasic(field.value.type) + "\n";
    code += Indent + " */\n";
    code += Indent + "public function get";
    code += ConvertCase(field.name, Case::kUpperCamel);
    code += "($j)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$o = $this->__offset(" +
            NumToString(field.value.offset) + ");\n";
    code += Indent + Indent + "$obj = new ";
    code +=
        ConvertCase(GenTypeGet(field.value.type), Case::kUpperCamel) + "();\n";

    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT:
        if (struct_def.fixed) {
          code += Indent + Indent;
          code += "return $o != 0 ? $obj->init($this->bb_pos +" +
                  NumToString(field.value.offset) + ", $this->bb) : null;\n";
        } else {
          code += Indent + Indent + "return $o != 0 ? $obj->init(";
          code += field.value.type.struct_def->fixed
                      ? "$o + $this->bb_pos"
                      : "$this->__indirect($o + $this->bb_pos)";
          code += ", $this->bb) : null;\n";
        }
        break;
      case BASE_TYPE_STRING:
        code += "// base_type_string\n";
        // TODO(chobie): do we need this?
        break;
      case BASE_TYPE_VECTOR:
        if (vectortype.base_type == BASE_TYPE_STRUCT) {
          code += Indent + Indent + "return $o != 0 ? $obj->init(";
          if (vectortype.struct_def->fixed) {
            code += "$this->__vector($o) + $j *";
            code += NumToString(InlineSize(vectortype));
          } else {
            code += "$this->__indirect($this->__vector($o) + $j * ";
            code += NumToString(InlineSize(vectortype)) + ")";
          }
          code += ", $this->bb) : null;\n";
        }
        break;
      case BASE_TYPE_UNION:
        code += Indent + Indent + "return $o != 0 ? $this->";
        code += GenGetter(field.value.type) + "($obj, $o); null;\n";
        break;
      default: break;
    }

    code += Indent + "}\n\n";
  }